

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

string * __thiscall CLI::App::get_footer_abi_cxx11_(App *this)

{
  bool bVar1;
  long in_RSI;
  string *in_RDI;
  string *__lhs;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  bVar1 = ::std::function::operator_cast_to_bool
                    ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                      *)0x1712b7);
  if (bVar1) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)__lhs);
    ::std::operator+(__lhs,(char)((ulong)in_RDI >> 0x38));
    ::std::operator+(__lhs,in_RDI);
    ::std::__cxx11::string::~string(local_30);
    ::std::__cxx11::string::~string(local_50);
  }
  else {
    ::std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x130));
  }
  return __lhs;
}

Assistant:

CLI11_NODISCARD std::string get_footer() const {
        return (footer_callback_) ? footer_callback_() + '\n' + footer_ : footer_;
    }